

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O0

int ComputeDistanceCost(Command *cmds,size_t num_commands,BrotliDistanceParams *orig_params,
                       BrotliDistanceParams *new_params,double *cost,HistogramDistance *tmp)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  uint *in_RCX;
  uint *in_RDX;
  ulong in_RSI;
  long in_RDI;
  double *in_R8;
  void *in_R9;
  double dVar4;
  uint32_t distance;
  Command *cmd;
  double extra_bits;
  uint32_t dist_extra;
  uint16_t dist_prefix;
  int equal_params;
  size_t i;
  uint32_t offset;
  uint32_t lcode;
  uint32_t hcode;
  uint32_t postfix_mask;
  uint32_t extra;
  uint32_t nbits;
  uint32_t dcode;
  size_t nbits_1;
  size_t offset_1;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask_1;
  size_t bucket;
  size_t dist;
  double local_118;
  undefined4 local_10c;
  ushort local_106;
  int local_104;
  ulong local_100;
  void *local_f8;
  double *local_f0;
  uint *local_e8;
  uint *local_e0;
  ulong local_d8;
  long local_d0;
  void *local_c0;
  long local_b8;
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  int local_98;
  uint local_94;
  uint *local_90;
  long local_88;
  uint local_7c;
  long local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  HistogramDistance *local_48;
  undefined4 *local_40;
  ushort *local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  void *local_10;
  HistogramDistance *in_stack_fffffffffffffff8;
  
  local_104 = 0;
  local_118 = 0.0;
  local_f8 = in_R9;
  local_f0 = in_R8;
  local_e8 = in_RCX;
  local_e0 = in_RDX;
  local_d8 = in_RSI;
  local_d0 = in_RDI;
  local_c0 = in_R9;
  memset(in_R9,0,0x880);
  *(undefined8 *)((long)local_c0 + 0x880) = 0;
  *(undefined8 *)((long)local_c0 + 0x888) = 0x7ff0000000000000;
  if ((*local_e0 == *local_e8) && (local_e0[1] == local_e8[1])) {
    local_104 = 1;
  }
  local_100 = 0;
  do {
    if (local_d8 <= local_100) {
      dVar4 = duckdb_brotli::BrotliPopulationCostDistance(in_stack_fffffffffffffff8);
      *local_f0 = dVar4 + local_118;
      return 1;
    }
    local_b8 = local_d0 + local_100 * 0x10;
    if (((*(uint *)(local_b8 + 4) & 0x1ffffff) != 0) && (0x7f < *(ushort *)(local_b8 + 0xc))) {
      if (local_104 == 0) {
        local_90 = local_e0;
        if ((*(ushort *)(local_b8 + 0xe) & 0x3ff) < local_e0[1] + 0x10) {
          local_7c = *(ushort *)(local_b8 + 0xe) & 0x3ff;
        }
        else {
          local_94 = *(ushort *)(local_b8 + 0xe) & 0x3ff;
          local_98 = (int)(uint)*(ushort *)(local_b8 + 0xe) >> 10;
          local_9c = *(int *)(local_b8 + 8);
          local_a0 = (1 << ((byte)*local_e0 & 0x1f)) - 1;
          local_a4 = (local_94 - local_e0[1]) - 0x10 >> ((byte)*local_e0 & 0x1f);
          local_a8 = (local_94 - local_e0[1]) - 0x10 & local_a0;
          local_ac = ((local_a4 & 1) + 2 << ((byte)local_98 & 0x1f)) + -4;
          local_7c = (local_ac + local_9c << ((byte)*local_e0 & 0x1f)) + local_a8 + local_e0[1] +
                     0x10;
        }
        if (*(ulong *)(local_e8 + 4) < (ulong)local_7c) {
          return 0;
        }
        local_20 = (ulong)local_7c;
        local_28 = (ulong)local_e8[1];
        local_30 = (ulong)*local_e8;
        local_38 = &local_106;
        local_40 = &local_10c;
        local_88 = local_b8;
        if (local_20 < local_28 + 0x10) {
          local_106 = (ushort)local_7c;
          local_10c = 0;
        }
        else {
          bVar2 = (byte)*local_e8;
          local_48 = (HistogramDistance *)
                     ((1L << (bVar2 + 2 & 0x3f)) + ((local_20 - 0x10) - local_28));
          iVar1 = 0x1f;
          if ((uint)local_48 != 0) {
            for (; (uint)local_48 >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          local_50 = (ulong)(iVar1 - 1U);
          local_58 = (ulong)((1 << (bVar2 & 0x1f)) - 1);
          local_60 = (ulong)local_48 & local_58;
          bVar3 = (byte)(iVar1 - 1U);
          local_68 = (ulong)local_48 >> (bVar3 & 0x3f) & 1;
          local_70 = local_68 + 2 << (bVar3 & 0x3f);
          local_78 = local_50 - local_30;
          local_106 = (short)local_78 * 0x400 |
                      (short)local_e8[1] + 0x10 +
                      (short)((local_78 + -1) * 2 + local_68 << (bVar2 & 0x3f)) + (short)local_60;
          local_10c = (undefined4)((ulong)((long)local_48 - local_70) >> (bVar2 & 0x3f));
          in_stack_fffffffffffffff8 = local_48;
        }
      }
      else {
        local_106 = *(ushort *)(local_b8 + 0xe);
      }
      local_18 = (long)(int)(local_106 & 0x3ff);
      local_10 = local_f8;
      *(int *)((long)local_f8 + local_18 * 4) = *(int *)((long)local_f8 + local_18 * 4) + 1;
      *(long *)((long)local_f8 + 0x880) = *(long *)((long)local_f8 + 0x880) + 1;
      local_118 = (double)((int)(uint)local_106 >> 10) + local_118;
    }
    local_100 = local_100 + 1;
  } while( true );
}

Assistant:

static BROTLI_BOOL ComputeDistanceCost(const Command* cmds,
                                       size_t num_commands,
                                       const BrotliDistanceParams* orig_params,
                                       const BrotliDistanceParams* new_params,
                                       double* cost,
                                       HistogramDistance* tmp) {
  size_t i;
  BROTLI_BOOL equal_params = BROTLI_FALSE;
  uint16_t dist_prefix;
  uint32_t dist_extra;
  double extra_bits = 0.0;
  HistogramClearDistance(tmp);

  if (orig_params->distance_postfix_bits == new_params->distance_postfix_bits &&
      orig_params->num_direct_distance_codes ==
      new_params->num_direct_distance_codes) {
    equal_params = BROTLI_TRUE;
  }

  for (i = 0; i < num_commands; i++) {
    const Command* cmd = &cmds[i];
    if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
      if (equal_params) {
        dist_prefix = cmd->dist_prefix_;
      } else {
        uint32_t distance = CommandRestoreDistanceCode(cmd, orig_params);
        if (distance > new_params->max_distance) {
          return BROTLI_FALSE;
        }
        PrefixEncodeCopyDistance(distance,
                                 new_params->num_direct_distance_codes,
                                 new_params->distance_postfix_bits,
                                 &dist_prefix,
                                 &dist_extra);
      }
      HistogramAddDistance(tmp, dist_prefix & 0x3FF);
      extra_bits += dist_prefix >> 10;
    }
  }

  *cost = BrotliPopulationCostDistance(tmp) + extra_bits;
  return BROTLI_TRUE;
}